

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_pcm_rb_init_ex(ma_format format,ma_uint32 channels,ma_uint32 subbufferSizeInFrames,
                           ma_uint32 subbufferCount,ma_uint32 subbufferStrideInFrames,
                           void *pOptionalPreallocatedBuffer,
                           ma_allocation_callbacks *pAllocationCallbacks,ma_pcm_rb *pRB)

{
  int iVar1;
  ma_result mVar2;
  ma_data_source_base *pDataSourceBase;
  
  mVar2 = MA_INVALID_ARGS;
  if (pRB != (ma_pcm_rb *)0x0) {
    memset(pRB,0,0x98);
    iVar1 = (&DAT_0017d490)[format] * channels;
    if (iVar1 != 0) {
      mVar2 = ma_rb_init_ex((ulong)(subbufferSizeInFrames * iVar1),(ulong)subbufferCount,
                            (ulong)(subbufferStrideInFrames * iVar1),pOptionalPreallocatedBuffer,
                            pAllocationCallbacks,&pRB->rb);
      if (mVar2 == MA_SUCCESS) {
        pRB->format = format;
        pRB->channels = channels;
        pRB->sampleRate = 0;
        (pRB->ds).vtable = (ma_data_source_vtable *)0x0;
        (pRB->ds).rangeBegInFrames = 0;
        (pRB->ds).rangeEndInFrames = 0;
        (pRB->ds).loopBegInFrames = 0;
        (pRB->ds).loopEndInFrames = 0;
        (pRB->ds).pCurrent = (ma_data_source *)0x0;
        (pRB->ds).pNext = (ma_data_source *)0x0;
        (pRB->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
        mVar2 = MA_SUCCESS;
        *(undefined8 *)&(pRB->ds).isLooping = 0;
        (pRB->ds).vtable = &ma_gRBDataSourceVTable;
        (pRB->ds).rangeBegInFrames = 0;
        (pRB->ds).rangeEndInFrames = 0xffffffffffffffff;
        (pRB->ds).loopBegInFrames = 0;
        (pRB->ds).loopEndInFrames = 0xffffffffffffffff;
        (pRB->ds).pCurrent = pRB;
      }
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_pcm_rb_init_ex(ma_format format, ma_uint32 channels, ma_uint32 subbufferSizeInFrames, ma_uint32 subbufferCount, ma_uint32 subbufferStrideInFrames, void* pOptionalPreallocatedBuffer, const ma_allocation_callbacks* pAllocationCallbacks, ma_pcm_rb* pRB)
{
    ma_uint32 bpf;
    ma_result result;

    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pRB);

    bpf = ma_get_bytes_per_frame(format, channels);
    if (bpf == 0) {
        return MA_INVALID_ARGS;
    }

    result = ma_rb_init_ex(subbufferSizeInFrames*bpf, subbufferCount, subbufferStrideInFrames*bpf, pOptionalPreallocatedBuffer, pAllocationCallbacks, &pRB->rb);
    if (result != MA_SUCCESS) {
        return result;
    }

    pRB->format     = format;
    pRB->channels   = channels;
    pRB->sampleRate = 0;    /* The sample rate is not passed in as a parameter. */

    /* The PCM ring buffer is a data source. We need to get that set up as well. */
    {
        ma_data_source_config dataSourceConfig = ma_data_source_config_init();
        dataSourceConfig.vtable = &ma_gRBDataSourceVTable;

        result = ma_data_source_init(&dataSourceConfig, &pRB->ds);
        if (result != MA_SUCCESS) {
            ma_rb_uninit(&pRB->rb);
            return result;
        }
    }

    return MA_SUCCESS;
}